

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

bool __thiscall
wasm::
SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
::
IteratorBase<wasm::SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Rb_tree_const_iterator<unsigned_int>_>
::operator==(IteratorBase<wasm::SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Rb_tree_const_iterator<unsigned_int>_>
             *this,Iterator *other)

{
  Fatal local_1a8;
  Iterator *local_20;
  Iterator *other_local;
  IteratorBase<wasm::SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Rb_tree_const_iterator<unsigned_int>_>
  *this_local;
  
  if (this->parent == other->parent) {
    local_20 = other;
    other_local = this;
    if ((this->usingFixed & 1U) != (other->usingFixed & 1U)) {
      Fatal::Fatal(&local_1a8);
      Fatal::operator<<(&local_1a8,
                        (char (*) [50])"SmallSet does not support changes while iterating");
      Fatal::~Fatal(&local_1a8);
    }
    if ((this->usingFixed & 1U) == 0) {
      this_local._7_1_ = std::operator==(&this->flexibleIterator,&other->flexibleIterator);
    }
    else {
      this_local._7_1_ = this->fixedIndex == other->fixedIndex;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Iterator& other) const {
      if (parent != other.parent) {
        return false;
      }
      // std::set allows changes while iterating. For us here, though, it would
      // be nontrivial to support that given we have two iterators that we
      // generalize over (switching "in the middle" would not be easy or fast),
      // so error on that.
      if (usingFixed != other.usingFixed) {
        Fatal() << "SmallSet does not support changes while iterating";
      }
      if (usingFixed) {
        return fixedIndex == other.fixedIndex;
      } else {
        return flexibleIterator == other.flexibleIterator;
      }
    }